

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file_handle.cpp
# Opt level: O1

void __thiscall
SplitFixture_Empty_Test<const_unsigned_char>::TestBody
          (SplitFixture_Empty_Test<const_unsigned_char> *this)

{
  TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)> *this_00;
  _func_int *message;
  TypeParam buffer;
  size_t size;
  AssertionResult gtest_ar;
  size_t total;
  undefined1 local_89;
  AssertHelper local_88;
  MatcherBase<unsigned_long> local_80;
  unsigned_long local_68;
  undefined1 local_60 [8];
  MatcherBase<unsigned_long> local_58;
  MatcherBase<const_void_*> local_40;
  MatcherBase<const_void_*> local_28;
  
  local_89 = 0;
  local_68 = 0;
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_28,&local_89);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_80,0);
  anon_unknown.dwarf_c158e::SplitFixture<const_unsigned_char>::mock_callback::gmock_call
            ((MockSpec<unsigned_long_(const_void_*,_unsigned_long)> *)local_60,
             &(this->super_SplitFixture<const_unsigned_char>).callback,
             (Matcher<const_void_*> *)&local_28,(Matcher<unsigned_long> *)&local_80);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_long_(const_void_*,_unsigned_long)>::
            InternalExpectedAt((MockSpec<unsigned_long_(const_void_*,_unsigned_long)> *)local_60,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
                               ,0x34,"this->callback","call (&buffer, size)");
  testing::internal::TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)>::Times(this_00,0)
  ;
  testing::internal::MatcherBase<const_void_*>::~MatcherBase
            ((MatcherBase<const_void_*> *)(local_60 + 0x20));
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)(local_60 + 8));
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_80);
  testing::internal::MatcherBase<const_void_*>::~MatcherBase(&local_28);
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_60,"size","total",&local_68,(unsigned_long *)&local_28);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x1ae738;
    }
    else {
      message = *local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
               ,0x38,(char *)message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))()
      ;
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_60 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TYPED_TEST (SplitFixture, Empty) {
    TypeParam buffer{};
    constexpr std::size_t size{0};
    EXPECT_CALL (this->callback, call (&buffer, size)).Times (0);

    using pstore::file::details::split;
    std::size_t const total = split<std::uint16_t> (&buffer, size, this->callback);
    EXPECT_EQ (size, total);
}